

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetMetricStreamerOpen
          (zet_context_handle_t hContext,zet_device_handle_t hDevice,
          zet_metric_group_handle_t hMetricGroup,zet_metric_streamer_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_streamer_handle_t *phMetricStreamer)

{
  object_t<_zet_metric_streamer_handle_t_*> *poVar1;
  zet_metric_streamer_handle_t *local_78;
  bad_alloc *anon_var_0;
  zet_pfnMetricStreamerOpen_t pfnOpen;
  dditable_t *dditable;
  zet_metric_streamer_handle_t *pp_Stack_40;
  ze_result_t result;
  zet_metric_streamer_handle_t *phMetricStreamer_local;
  ze_event_handle_t hNotificationEvent_local;
  zet_metric_streamer_desc_t *desc_local;
  zet_metric_group_handle_t hMetricGroup_local;
  zet_device_handle_t hDevice_local;
  zet_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnOpen = *(zet_pfnMetricStreamerOpen_t *)(hContext + 8);
  if (*(code **)(pfnOpen + 0x7b0) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDevice_local = *(zet_device_handle_t *)hContext;
    hMetricGroup_local = *(zet_metric_group_handle_t *)hDevice;
    desc_local = *(zet_metric_streamer_desc_t **)hMetricGroup;
    if (hNotificationEvent == (ze_event_handle_t)0x0) {
      local_78 = (zet_metric_streamer_handle_t *)0x0;
    }
    else {
      local_78 = *(zet_metric_streamer_handle_t **)hNotificationEvent;
    }
    phMetricStreamer_local = local_78;
    pp_Stack_40 = phMetricStreamer;
    hNotificationEvent_local = (ze_event_handle_t)desc;
    dditable._4_4_ =
         (**(code **)(pfnOpen + 0x7b0))
                   (hDevice_local,hMetricGroup_local,desc_local,desc,local_78,phMetricStreamer);
    hContext_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_zet_metric_streamer_handle_t*>,_zet_metric_streamer_handle_t*>
               ::getInstance<_zet_metric_streamer_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_streamer_handle_t*>,_zet_metric_streamer_handle_t*>
                           *)(context + 0x1380),pp_Stack_40,(dditable_t **)&pfnOpen);
      *pp_Stack_40 = (zet_metric_streamer_handle_t)poVar1;
      hContext_local._4_4_ = dditable._4_4_;
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerOpen(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_streamer_desc_t* desc,               ///< [in,out] metric streamer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification
        zet_metric_streamer_handle_t* phMetricStreamer  ///< [out] handle of metric streamer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_context_object_t*>( hContext )->dditable;
        auto pfnOpen = dditable->zet.MetricStreamer.pfnOpen;
        if( nullptr == pfnOpen )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<zet_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // convert loader handle to driver handle
        hMetricGroup = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->handle;

        // convert loader handle to driver handle
        hNotificationEvent = ( hNotificationEvent ) ? reinterpret_cast<ze_event_object_t*>( hNotificationEvent )->handle : nullptr;

        // forward to device-driver
        result = pfnOpen( hContext, hDevice, hMetricGroup, desc, hNotificationEvent, phMetricStreamer );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricStreamer = reinterpret_cast<zet_metric_streamer_handle_t>(
                context->zet_metric_streamer_factory.getInstance( *phMetricStreamer, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }